

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetBX2Transform(ndicapi *pol,int portHandle,float *transform)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float *pfVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = pol->Bx2HandleCount;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    do {
      if ((uint)pol->Bx2Handles[uVar7] == portHandle) goto LAB_00109ccd;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    uVar7 = (ulong)uVar1;
  }
LAB_00109ccd:
  uVar6 = 1;
  if ((uint)uVar7 != uVar1) {
    uVar7 = uVar7 & 0xffffffff;
    uVar2 = *(undefined8 *)pol->Bx2Transforms[uVar7];
    uVar3 = *(undefined8 *)(pol->Bx2Transforms[uVar7] + 2);
    pfVar5 = pol->Bx2Transforms[uVar7];
    uVar4 = *(undefined8 *)(pfVar5 + 6);
    *(undefined8 *)(transform + 4) = *(undefined8 *)(pfVar5 + 4);
    *(undefined8 *)(transform + 6) = uVar4;
    *(undefined8 *)transform = uVar2;
    *(undefined8 *)(transform + 2) = uVar3;
    if ((pol->Bx2HandlesStatus[uVar7] & 4) == 0) {
      uVar6 = pol->Bx2HandlesStatus[uVar7] >> 7 & 2;
    }
  }
  return uVar6;
}

Assistant:

ndicapiExport int ndiGetBX2Transform(ndicapi* pol, int portHandle, float transform[8])
{
  int i, n;

  n = pol->Bx2HandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->Bx2Handles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  memcpy(&transform[0], &pol->Bx2Transforms[i][0], sizeof(float) * 8);
  if (pol->Bx2HandlesStatus[i] & NDI_HANDLE_DISABLED)
  {
    return NDI_DISABLED;
  }
  else if (pol->Bx2HandlesStatus[i] & NDI_BX2_MISSING_BIT)
  {
    return NDI_MISSING;
  }

  return NDI_OKAY;
}